

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::DeepTiledInputFile::rawTileData
          (DeepTiledInputFile *this,int *dx,int *dy,int *lx,int *ly,char *pixelData,
          uint64_t *pixelDataSize)

{
  int iVar1;
  exr_context_t p_Var2;
  element_type *peVar3;
  ostream *poVar4;
  char *pcVar5;
  ArgExc *pAVar6;
  undefined4 *in_RCX;
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  undefined4 *in_R8;
  undefined4 *in_R9;
  ulong *in_stack_00000008;
  stringstream _iex_throw_s_1;
  stringstream _iex_throw_s;
  DeepTileChunkHeader *dch;
  uint64_t cbytes;
  exr_chunk_info_t cinfo;
  stringstream local_3a0 [16];
  ostream local_390 [392];
  stringstream local_208 [16];
  ostream local_1f8 [376];
  undefined4 *local_80;
  ulong local_78;
  undefined1 local_70 [4];
  undefined4 local_6c;
  undefined4 local_68;
  byte local_5c;
  byte local_5b;
  long local_50;
  undefined8 local_48;
  long local_38;
  undefined4 *local_30;
  undefined4 *local_28;
  undefined4 *local_20;
  undefined4 *local_18;
  undefined4 *local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  p_Var2 = Context::operator_cast_to__priv_exr_context_t_((Context *)0x1b8c11);
  peVar3 = std::
           __shared_ptr_access<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b8c24);
  iVar1 = exr_read_tile_chunk_info
                    (p_Var2,peVar3->partNumber,*local_10,*local_18,*local_20,*local_28,local_70);
  if (iVar1 != 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_3a0);
    poVar4 = std::operator<<(local_390,"Error reading deep tile data from image file \"");
    pcVar5 = fileName((DeepTiledInputFile *)0x1b8f58);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::operator<<(poVar4,"\". Unable to query data block information.");
    pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar6,local_3a0);
    __cxa_throw(pAVar6,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  local_78 = local_50 + local_38 + 0x28;
  if ((local_30 == (undefined4 *)0x0) || (*in_stack_00000008 < local_78)) {
    *in_stack_00000008 = local_78;
  }
  else {
    *in_stack_00000008 = local_78;
    local_80 = local_30;
    *local_30 = local_6c;
    local_30[1] = local_68;
    local_30[2] = (uint)local_5c;
    local_30[3] = (uint)local_5b;
    *(long *)(local_30 + 4) = local_38;
    *(long *)(local_30 + 6) = local_50;
    *(undefined8 *)(local_30 + 8) = local_48;
    local_30 = local_30 + 10;
    p_Var2 = Context::operator_cast_to__priv_exr_context_t_((Context *)0x1b8dad);
    peVar3 = std::
             __shared_ptr_access<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1b8dc0);
    iVar1 = exr_read_deep_chunk(p_Var2,peVar3->partNumber,local_70,(long)local_30 + local_38,
                                local_30);
    if (iVar1 != 0) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream(local_208);
      poVar4 = std::operator<<(local_1f8,"Error reading deep tiled data from image file \"");
      pcVar5 = fileName((DeepTiledInputFile *)0x1b8e32);
      poVar4 = std::operator<<(poVar4,pcVar5);
      poVar4 = std::operator<<(poVar4,"\". Unable to read raw tile data of ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*in_stack_00000008);
      std::operator<<(poVar4," bytes.");
      pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(pAVar6,local_208);
      __cxa_throw(pAVar6,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
  }
  return;
}

Assistant:

void
DeepTiledInputFile::rawTileData (
    int&      dx,
    int&      dy,
    int&      lx,
    int&      ly,
    char*     pixelData,
    uint64_t& pixelDataSize) const
{
    exr_chunk_info_t cinfo;

    static_assert (sizeof(DeepTileChunkHeader) == 40, "Expect a 40-byte tiled chunk header");

    if (EXR_ERR_SUCCESS == exr_read_tile_chunk_info (
            _ctxt, _data->partNumber, dx, dy, lx, ly, &cinfo))
    {
        uint64_t cbytes;
        cbytes = sizeof (DeepTileChunkHeader);
        cbytes += cinfo.sample_count_table_size;
        cbytes += cinfo.packed_size;

        if (!pixelData || cbytes > pixelDataSize)
        {
            pixelDataSize = cbytes;
            return;
        }

        pixelDataSize = cbytes;

        DeepTileChunkHeader* dch = reinterpret_cast<DeepTileChunkHeader*> (pixelData);
        dch->dx = cinfo.start_x;
        dch->dy = cinfo.start_y;
        dch->lx = cinfo.level_x;
        dch->ly = cinfo.level_y;
        dch->packedCountSize = cinfo.sample_count_table_size;
        dch->packedDataSize = cinfo.packed_size;
        dch->unpackedDataSize = cinfo.unpacked_size;

        pixelData += sizeof(DeepTileChunkHeader);

        if (EXR_ERR_SUCCESS !=
            exr_read_deep_chunk (
                _ctxt,
                _data->partNumber,
                &cinfo,
                pixelData + cinfo.sample_count_table_size,
                pixelData))
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Error reading deep tiled data from image "
                "file \""
                << fileName () << "\". Unable to read raw tile data of "
                << pixelDataSize << " bytes.");
        }
    }
    else
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Error reading deep tile data from image "
            "file \""
            << fileName ()
            << "\". Unable to query data block information.");
    }
}